

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

CItem * __thiscall am_CList::Find(am_CList *this,Am_Constraint *item)

{
  CItem *pCVar1;
  
  while( true ) {
    pCVar1 = this->head;
    if ((pCVar1 == (CItem *)0x0) || (pCVar1->value == item)) break;
    this = (am_CList *)&pCVar1->next;
  }
  return pCVar1;
}

Assistant:

CItem *
am_CList::Find(Am_Constraint *item)
{
  CItem *curr = head;
  while (curr) {
    if (curr->value == item) {
      return curr;
    }
    curr = curr->next;
  }
  return nullptr;
}